

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_PluginTest_InstallPlugin_Test::testBody(TEST_PluginTest_InstallPlugin_Test *this)

{
  DummyPlugin *pDVar1;
  TestRegistry *pTVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UtestShell *pUVar5;
  char *pcVar6;
  char *pcVar7;
  TestTerminator *pTVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_PluginTest_InstallPlugin_Test *local_10;
  TEST_PluginTest_InstallPlugin_Test *this_local;
  
  pDVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin;
  local_10 = this;
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])();
  if (pDVar1 == (DummyPlugin *)CONCAT44(extraout_var,iVar3)) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x78,pTVar8);
  }
  else {
    iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])
                      ();
    iVar4 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])
                      ();
    if (CONCAT44(extraout_var_00,iVar3) != CONCAT44(extraout_var_01,iVar4)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x78);
    }
    if ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin !=
        (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x78);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom(&local_20);
    pcVar6 = SimpleString::asCharString(&local_20);
    (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])();
    StringFrom(local_40);
    pcVar7 = SimpleString::asCharString(local_40);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x78,pTVar8);
    SimpleString::~SimpleString(local_40);
    SimpleString::~SimpleString(&local_20);
  }
  pDVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin;
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  SimpleString::SimpleString(&local_50,"GenericPlugin");
  iVar3 = (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_50);
  SimpleString::~SimpleString(&local_50);
  if (pDVar1 == (DummyPlugin *)CONCAT44(extraout_var_02,iVar3)) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x79,pTVar8);
  }
  else {
    pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_60,"GenericPlugin");
    iVar3 = (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_60);
    pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_70,"GenericPlugin");
    iVar4 = (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_70);
    SimpleString::~SimpleString(&local_70);
    SimpleString::~SimpleString(&local_60);
    if (CONCAT44(extraout_var_03,iVar3) != CONCAT44(extraout_var_04,iVar4)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x79);
    }
    if ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin !=
        (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x79);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom(&local_80);
    pcVar6 = SimpleString::asCharString(&local_80);
    pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_a0,"GenericPlugin");
    (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_a0);
    StringFrom(&local_90);
    pcVar7 = SimpleString::asCharString(&local_90);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x79,pTVar8);
    SimpleString::~SimpleString(&local_90);
    SimpleString::~SimpleString(&local_a0);
    SimpleString::~SimpleString(&local_80);
  }
  pUVar5 = UtestShell::getCurrent();
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0x12])()
  ;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,(long)iVar3,"LONGS_EQUAL(1, registry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0x7a,pTVar8);
  return;
}

Assistant:

TEST(PluginTest, InstallPlugin)
{
    CHECK_EQUAL(firstPlugin, registry->getFirstPlugin());
    CHECK_EQUAL(firstPlugin, registry->getPluginByName(GENERIC_PLUGIN));
    LONGS_EQUAL(1, registry->countPlugins());
}